

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::DefaultPrintTo<std::vector<bool,std::allocator<bool>>>
               (undefined8 param_1,long *param_2,ostream *param_3)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  ulong *puVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_33,1);
  puVar4 = (ulong *)*param_2;
  if ((puVar4 != (ulong *)param_2[2]) || ((int)param_2[3] != 0)) {
    lVar3 = 0;
    uVar6 = 0;
    do {
      if ((lVar3 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_31,1), lVar3 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(param_3," ...",4);
        goto LAB_0011d6cd;
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_32,1);
      bVar7 = (*puVar4 >> (uVar6 & 0x3f) & 1) != 0;
      pcVar2 = "true";
      if (!bVar7) {
        pcVar2 = "false";
      }
      std::__ostream_insert<char,std::char_traits<char>>(param_3,pcVar2,5 - (ulong)bVar7);
      iVar5 = (int)uVar6;
      uVar1 = iVar5 + 1;
      if (iVar5 == 0x3f) {
        uVar1 = 0;
      }
      uVar6 = (ulong)uVar1;
      puVar4 = puVar4 + (iVar5 == 0x3f);
      lVar3 = lVar3 + 1;
    } while ((puVar4 != (ulong *)param_2[2]) || (uVar1 != *(uint *)(param_2 + 3)));
    if (lVar3 != 0) {
LAB_0011d6cd:
      std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_34,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_3,&local_35,1);
  return;
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}